

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.hpp
# Opt level: O0

Result * CoreML::loadSpecification<CoreML::Specification::Model>
                   (Result *__return_storage_ptr__,Model *formatObj,istream *in)

{
  bool bVar1;
  int total_bytes_limit;
  allocator<char> local_f1;
  string local_f0;
  undefined1 local_c0 [8];
  CodedInputStream codedInput;
  IstreamInputStream rawInput;
  istream *in_local;
  Model *formatObj_local;
  
  google::protobuf::io::IstreamInputStream::IstreamInputStream
            ((IstreamInputStream *)&codedInput.extension_factory_,in,-1);
  google::protobuf::io::CodedInputStream::CodedInputStream
            ((CodedInputStream *)local_c0,(ZeroCopyInputStream *)&codedInput.extension_factory_);
  total_bytes_limit = std::numeric_limits<int>::max();
  google::protobuf::io::CodedInputStream::SetTotalBytesLimit
            ((CodedInputStream *)local_c0,total_bytes_limit,-1);
  bVar1 = google::protobuf::MessageLite::ParseFromCodedStream
                    (&formatObj->super_MessageLite,(CodedInputStream *)local_c0);
  if (bVar1) {
    Result::Result(__return_storage_ptr__);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"unable to deserialize object",&local_f1);
    Result::Result(__return_storage_ptr__,FAILED_TO_DESERIALIZE,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
  }
  google::protobuf::io::CodedInputStream::~CodedInputStream((CodedInputStream *)local_c0);
  google::protobuf::io::IstreamInputStream::~IstreamInputStream
            ((IstreamInputStream *)&codedInput.extension_factory_);
  return __return_storage_ptr__;
}

Assistant:

static inline Result loadSpecification(T& formatObj,
                                           std::istream& in) {

        google::protobuf::io::IstreamInputStream rawInput(&in);
        google::protobuf::io::CodedInputStream codedInput(&rawInput);

        // Support models up to 2GB
        codedInput.SetTotalBytesLimit(std::numeric_limits<int>::max(), -1);

        if (!formatObj.ParseFromCodedStream(&codedInput)) {
            return Result(ResultType::FAILED_TO_DESERIALIZE,
                          "unable to deserialize object");
        }

        return Result();
    }